

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::SetValue(CacheEntry *this,cmValue value)

{
  bool bVar1;
  string *psVar2;
  CacheEntry *this_local;
  cmValue value_local;
  
  this_local = (CacheEntry *)value.Value;
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    std::__cxx11::string::operator=((string *)this,(string *)psVar2);
    this->Initialized = true;
  }
  else {
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetValue(cmValue value)
{
  if (value) {
    this->Value = *value;
    this->Initialized = true;
  } else {
    this->Value.clear();
  }
}